

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

bool sharesAxis(QTextTableCell *cell,Edge edge,QTextTableCell *competingCell,Edge competingCellEdge)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  undefined4 in_ESI;
  int local_68;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_4c;
  int local_3c;
  byte local_1;
  
  switch(in_ESI) {
  case 0:
    iVar1 = QTextTableCell::row((QTextTableCell *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = QTextTableCell::row((QTextTableCell *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_ECX == 2) {
      local_3c = QTextTableCell::rowSpan
                           ((QTextTableCell *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      local_3c = 0;
    }
    local_1 = iVar1 == iVar2 + local_3c;
    break;
  case 1:
    iVar1 = QTextTableCell::column
                      ((QTextTableCell *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = QTextTableCell::columnSpan
                      ((QTextTableCell *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar3 = QTextTableCell::column
                      ((QTextTableCell *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_ECX == 3) {
      local_68 = 0;
    }
    else {
      local_68 = QTextTableCell::columnSpan
                           ((QTextTableCell *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    local_1 = iVar1 + iVar2 == iVar3 + local_68;
    break;
  case 2:
    iVar1 = QTextTableCell::row((QTextTableCell *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = QTextTableCell::rowSpan
                      ((QTextTableCell *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar3 = QTextTableCell::row((QTextTableCell *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_ECX == 0) {
      local_4c = 0;
    }
    else {
      local_4c = QTextTableCell::rowSpan
                           ((QTextTableCell *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    local_1 = iVar1 + iVar2 == iVar3 + local_4c;
    break;
  case 3:
    iVar1 = QTextTableCell::column
                      ((QTextTableCell *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = QTextTableCell::column((QTextTableCell *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
    if (in_ECX == 1) {
      iVar3 = QTextTableCell::columnSpan
                        ((QTextTableCell *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
    }
    else {
      iVar3 = 0;
    }
    local_1 = iVar1 == iVar2 + iVar3;
  }
  return (bool)(local_1 & 1);
}

Assistant:

static inline bool sharesAxis(const QTextTableCell &cell, QCss::Edge edge,
                              const QTextTableCell &competingCell, QCss::Edge competingCellEdge)
{
    Q_ASSERT(isVerticalAxis(edge) == isVerticalAxis(competingCellEdge));

    switch (edge) {
    case QCss::TopEdge:
        return cell.row() ==
                competingCell.row() + (competingCellEdge == QCss::BottomEdge ? competingCell.rowSpan() : 0);
    case QCss::BottomEdge:
        return cell.row() + cell.rowSpan() ==
                competingCell.row() + (competingCellEdge == QCss::TopEdge ? 0 : competingCell.rowSpan());
    case QCss::LeftEdge:
        return cell.column() ==
                competingCell.column() + (competingCellEdge == QCss::RightEdge ? competingCell.columnSpan() : 0);
    case QCss::RightEdge:
        return cell.column() + cell.columnSpan() ==
                competingCell.column() + (competingCellEdge == QCss::LeftEdge ? 0 : competingCell.columnSpan());
    default:
        Q_UNREACHABLE_RETURN(false);
    }
}